

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O1

int done_in_by_format(monst *mtmp,char *buf)

{
  short sVar1;
  uint uVar2;
  permonst *ppVar3;
  bool bVar4;
  boolean bVar5;
  int iVar6;
  obj *poVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  
  bVar4 = true;
  if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
     ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
    if (mtmp->wormno == '\0') {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
            (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))))
      goto LAB_00195cb0;
LAB_00195cff:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar7 = which_armor(mtmp,4), poVar7 == (obj *)0x0 ||
          (poVar7 = which_armor(mtmp,4), poVar7->otyp != 0x4f)))) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
              (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
              youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
          if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_00195e35;
          iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
          bVar4 = false;
          if ((iVar6 < 0x41) || (bVar4 = false, u.uprops[0x42].intrinsic != 0)) goto LAB_00195e50;
          goto LAB_00195e3f;
        }
      }
      else {
LAB_00195e35:
        if (u.uprops[0x42].intrinsic == 0) {
LAB_00195e3f:
          if (u.uprops[0x42].extrinsic == 0) {
            bVar5 = match_warn_of_mon(mtmp);
            bVar4 = bVar5 == '\0';
            goto LAB_00195e50;
          }
        }
      }
    }
    else {
      bVar5 = worm_known(level,mtmp);
      if (bVar5 == '\0') goto LAB_00195cff;
LAB_00195cb0:
      uVar2 = *(uint *)&mtmp->field_0x60;
      if ((((uVar2 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_00195cf1;
        goto LAB_00195cff;
      }
      if ((uVar2 & 0x280) != 0) goto LAB_00195cff;
LAB_00195cf1:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_00195cff;
    }
    bVar4 = false;
  }
LAB_00195e50:
  *buf = '\0';
  ppVar3 = mtmp->data;
  iVar6 = 0;
  if (((ppVar3->geno & 0x1000) != 0) &&
     (((ppVar3 != mons + 0x120 || (iVar6 = 0, (mtmp->field_0x63 & 0x10) != 0)) &&
      (iVar6 = 1, (ppVar3->mflags2 & 0x80000) == 0)))) {
    sVar8 = strlen(buf);
    builtin_strncpy(buf + sVar8,"the ",5);
  }
  if ((mtmp->data == mons + 0x12a) && (mtmp->mnamelth != '\0')) {
    sVar8 = strlen(buf);
    builtin_strncpy(buf + sVar8,"the ",5);
    iVar6 = 1;
  }
  if ((mtmp->field_0x60 & 2) != 0) {
    sVar8 = strlen(buf);
    builtin_strncpy(buf + sVar8,"invisible ",0xb);
  }
  if (!bVar4) {
    sVar8 = strlen(buf);
    builtin_strncpy(buf + sVar8,"hallucinogen-distorted ",0x18);
  }
  if (mtmp->data == mons + 0x12a) {
    sVar8 = strlen(buf);
    builtin_strncpy(buf + sVar8,"ghost",6);
    if (mtmp->mnamelth == '\0') goto LAB_0019601a;
    pcVar9 = eos(buf);
    sVar1 = mtmp->mxlth;
    pcVar11 = " of %s";
  }
  else {
    if ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) != 0) {
      pcVar9 = eos(buf);
      pcVar11 = "Ms.";
      if ((mtmp->field_0x60 & 1) == 0) {
        pcVar11 = "Mr.";
      }
      pcVar10 = shkname(mtmp);
      sprintf(pcVar9,"%s %s, the shopkeeper",pcVar11,pcVar10);
      iVar6 = 1;
      goto LAB_0019601a;
    }
    if ((*(uint *)&mtmp->field_0x60 & 0x14000000) != 0) {
      pcVar9 = m_monnam(mtmp);
      strcat(buf,pcVar9);
      goto LAB_0019601a;
    }
    pcVar9 = mons_mname(mtmp->data);
    strcat(buf,pcVar9);
    if (mtmp->mnamelth == '\0') goto LAB_0019601a;
    pcVar9 = eos(buf);
    sVar1 = mtmp->mxlth;
    pcVar11 = " called %s";
  }
  sprintf(pcVar9,pcVar11,(undefined1 *)((long)(mtmp->mtrack + 0x18) + (long)sVar1));
LAB_0019601a:
  if (multi != 0) {
    if (multi_txt[0] == '\0') {
      sVar8 = strlen(buf);
      builtin_strncpy(buf + sVar8,", while helpless",0x11);
    }
    else {
      pcVar9 = eos(buf);
      sprintf(pcVar9,", while %s",multi_txt);
    }
  }
  return iVar6;
}

Assistant:

int done_in_by_format(const struct monst *mtmp, char *buf)
{
	int kfmt;
	boolean distorted = (boolean)(Hallucination && canspotmon(level, mtmp));

	buf[0] = '\0';
	kfmt = KILLED_BY_AN;
	/* "killed by the high priest of Crom" is okay, "killed by the high
	   priest" alone isn't */
	if ((mtmp->data->geno & G_UNIQ) != 0 && !(mtmp->data == &mons[PM_HIGH_PRIEST] && !mtmp->ispriest)) {
	    if (!type_is_pname(mtmp->data))
		strcat(buf, "the ");
	    kfmt = KILLED_BY;
	}
	/* _the_ <invisible> <distorted> ghost of Dudley */
	if (mtmp->data == &mons[PM_GHOST] && mtmp->mnamelth) {
		strcat(buf, "the ");
		kfmt = KILLED_BY;
	}
	if (mtmp->minvis)
		strcat(buf, "invisible ");
	if (distorted)
		strcat(buf, "hallucinogen-distorted ");

	if (mtmp->data == &mons[PM_GHOST]) {
		strcat(buf, "ghost");
		if (mtmp->mnamelth) sprintf(eos(buf), " of %s", NAME(mtmp));
	} else if (mtmp->isshk) {
		sprintf(eos(buf), "%s %s, the shopkeeper",
			(mtmp->female ? "Ms." : "Mr."), shkname(mtmp));
		kfmt = KILLED_BY;
	} else if (mtmp->ispriest || mtmp->isminion) {
		/* m_monnam() suppresses "the" prefix plus "invisible", and
		   it overrides the effect of Hallucination on priestname() */
		const char *killer_mon = m_monnam(mtmp);
		strcat(buf, killer_mon);
	} else {
		strcat(buf, mons_mname(mtmp->data));
		if (mtmp->mnamelth)
		    sprintf(eos(buf), " called %s", NAME(mtmp));
	}

	if (multi) {
	    if (*multi_txt)
		sprintf(eos(buf), ", while %s", multi_txt);
	    else
		strcat(buf, ", while helpless");
	}

	return kfmt;
}